

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvrm.c
# Opt level: O3

int is_fifo_and_addr_belongs(gpu_object *obj,uint64_t ctx)

{
  uint32_t uVar1;
  ulong uVar2;
  fifo_state *pfVar3;
  uint uVar4;
  
  uVar1 = obj->class_;
  uVar4 = 0;
  if ((int)uVar1 < 0xa16f) {
    if ((int)uVar1 < 0x866f) {
      if ((uVar1 != 0x506f) && (uVar1 != 0x826f)) {
        return 0;
      }
    }
    else if (((uVar1 != 0x866f) && (uVar1 != 0x906f)) && (uVar1 != 0xa06f)) {
      return 0;
    }
  }
  else if ((int)uVar1 < 0xc06f) {
    if (((uVar1 != 0xa16f) && (uVar1 != 0xa26f)) && (uVar1 != 0xb06f)) {
      return 0;
    }
  }
  else if (((uVar1 != 0xc06f) && (uVar1 != 0xc46f)) && (uVar1 != 0xc36f)) {
    return 0;
  }
  pfVar3 = get_fifo_state(obj);
  uVar2 = (pfVar3->ib).addr;
  if (uVar2 <= ctx) {
    uVar4 = (uint)(ctx < uVar2 + (pfVar3->ib).entries * 8);
  }
  return uVar4;
}

Assistant:

int is_fifo_and_addr_belongs(struct gpu_object *obj, uint64_t ctx)
{
	if (is_fifo_ib_class(obj->class_))
	{
		struct fifo_state *state = get_fifo_state(obj);
		return ctx >= state->ib.addr &&
				ctx < state->ib.addr + state->ib.entries * 8;
	}

	//TODO: figure out how to get buffer boundary
	if (0 && is_fifo_dma_class(obj->class_))
	{
		struct fifo_state *state = get_fifo_state(obj);
		return ctx >= state->user.addr &&
				ctx < state->user.addr /*+ what?*/;
	}

	return 0;
}